

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

void gl_RecalcVertexHeights(vertex_t *v)

{
  uint uVar1;
  int iVar2;
  sector_t *psVar3;
  float *pfVar4;
  secplane_t *psVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  secplane_t *psVar8;
  size_t __n;
  ulong uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  float fVar13;
  
  v->numheights = 0;
  if (0 < v->numsectors) {
    lVar10 = 0;
    do {
      iVar11 = 0;
      do {
        psVar3 = v->sectors[lVar10];
        psVar5 = &psVar3->ceilingplane;
        psVar6 = &psVar3->ceilingplane;
        bVar12 = iVar11 != 0;
        if (bVar12) {
          psVar5 = &psVar3->floorplane;
          psVar6 = &psVar3->floorplane;
        }
        psVar7 = &psVar3->ceilingplane;
        if (bVar12) {
          psVar7 = &psVar3->floorplane;
        }
        psVar8 = &psVar3->ceilingplane;
        if (bVar12) {
          psVar8 = &psVar3->floorplane;
        }
        fVar13 = (float)(((v->p).Y * (psVar7->normal).Y + (v->p).X * (psVar5->normal).X + psVar6->D)
                        * psVar8->negiC);
        uVar1 = v->numheights;
        if ((int)uVar1 < 1) {
          uVar9 = 0;
        }
        else {
          pfVar4 = v->heightlist;
          __n = (long)(int)uVar1 << 2;
          uVar9 = 0;
          do {
            if (fVar13 == pfVar4[uVar9]) goto LAB_0036e04d;
            if (fVar13 < pfVar4[uVar9]) {
              memmove(pfVar4 + uVar9 + 1,pfVar4 + uVar9,__n);
              v->heightlist[uVar9] = fVar13;
              v->numheights = v->numheights + 1;
              goto LAB_0036e04d;
            }
            uVar9 = uVar9 + 1;
            __n = __n - 4;
          } while (uVar1 != uVar9);
          uVar9 = (ulong)uVar1;
        }
LAB_0036e04d:
        iVar2 = v->numheights;
        if ((int)uVar9 == iVar2) {
          v->numheights = iVar2 + 1;
          v->heightlist[iVar2] = fVar13;
        }
        bVar12 = iVar11 == 0;
        iVar11 = iVar11 + 1;
      } while (bVar12);
      lVar10 = lVar10 + 1;
    } while (lVar10 < v->numsectors);
  }
  if (v->numheights < 3) {
    v->numheights = 0;
  }
  v->dirty = false;
  return;
}

Assistant:

void gl_RecalcVertexHeights(vertex_t * v)
{
	int i,j,k;
	float height;

	v->numheights=0;
	for(i=0;i<v->numsectors;i++)
	{
		for(j=0;j<2;j++)
		{
			if (j==0) height=v->sectors[i]->ceilingplane.ZatPoint(v);
			else height=v->sectors[i]->floorplane.ZatPoint(v);

			for(k=0;k<v->numheights;k++)
			{
				if (height == v->heightlist[k]) break;
				if (height < v->heightlist[k])
				{
					memmove(&v->heightlist[k+1], &v->heightlist[k], sizeof(float) * (v->numheights-k));
					v->heightlist[k]=height;
					v->numheights++;
					break;
				}
			}
			if (k==v->numheights) v->heightlist[v->numheights++]=height;
		}
	}
	if (v->numheights<=2) v->numheights=0;	// is not in need of any special attention
	v->dirty = false;
}